

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall QRasterPaintEnginePrivate::updateClipping(QRasterPaintEnginePrivate *this)

{
  QRasterPaintEngineState *pQVar1;
  QRasterPaintEnginePrivate *in_RDI;
  QRasterPaintEngineState *s;
  QRasterPaintEngine *q;
  QPaintEngineExPrivate *in_stack_00000030;
  
  q_func(in_RDI);
  pQVar1 = QRasterPaintEngine::state((QRasterPaintEngine *)0x562e9b);
  if (((byte)(pQVar1->super_QPainterState).field_0x1a0 >> 2 & 1) != 0) {
    qrasterpaintengine_state_setNoClip((QRasterPaintEngineState *)in_RDI);
    QPaintEngineExPrivate::replayClipOperations(in_stack_00000030);
  }
  return;
}

Assistant:

void QRasterPaintEnginePrivate::updateClipping()
{
    Q_Q(QRasterPaintEngine);
    QRasterPaintEngineState *s = q->state();

    if (!s->clipEnabled)
        return;

    qrasterpaintengine_state_setNoClip(s);
    replayClipOperations();
}